

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_suite1.cpp
# Opt level: O1

void test_suite1(fctkern_t *fctkern_ptr__)

{
  fct_clp_t *clp_00;
  ts_mode tVar1;
  size_t sVar2;
  fctcl_t *clo;
  undefined8 *puVar3;
  fct_logger_types_t *pfVar4;
  void *pvVar5;
  bool bVar6;
  FILE *__stream;
  int iVar7;
  fct_ts_t *pfVar8;
  void **ppvVar9;
  char *pcVar10;
  char *option;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  fct_logger_i *itm;
  fct_test_t *pfVar15;
  char **ppcVar16;
  int iVar17;
  char *s;
  long lVar18;
  ulong uVar19;
  fct_clp_t *clp;
  char *err;
  int local_94;
  int local_80;
  fct_logger_types_t *local_48 [3];
  
  pfVar8 = (fct_ts_t *)calloc(1,0x128);
  if (pfVar8 == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x483
                  ,"fct_ts_t *fct_ts_new(const char *)");
  }
  strncpy(pfVar8->name,"test_suite1",0x100);
  pfVar8->name[0xff] = '\0';
  pfVar8->mode = ts_mode_cnt;
  ppvVar9 = (void **)malloc(0x40);
  (pfVar8->test_list).itm_list = ppvVar9;
  if (ppvVar9 != (void **)0x0) {
    (pfVar8->test_list).avail_itm_num = 8;
    (pfVar8->test_list).used_itm_num = 0;
  }
  (fctkern_ptr__->ns).ts_curr = pfVar8;
  if (fctkern_ptr__->cl_is_parsed != 0) goto LAB_00104f81;
  local_80 = 1;
  iVar17 = 0;
  if ((fctkern_ptr__ != (fctkern_t *)0x0) &&
     ((iVar17 = 0, fctkern_ptr__->cl_user_opts == (fctcl_init_t *)0x0 ||
      (iVar7 = fct_clp__add_options(&fctkern_ptr__->cl_parser,fctkern_ptr__->cl_user_opts),
      iVar7 != 0)))) {
    clp_00 = &fctkern_ptr__->cl_parser;
    iVar7 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
    if (iVar7 != 0) {
      iVar17 = fctkern_ptr__->cl_argc;
      ppcVar16 = fctkern_ptr__->cl_argv;
      pcVar14 = (fctkern_ptr__->cl_parser).error_msg;
      (fctkern_ptr__->cl_parser).error_msg[0] = '\0';
      (fctkern_ptr__->cl_parser).is_error = 0;
      if (1 < iVar17) {
        local_94 = 1;
        do {
          pcVar10 = fctstr_clone(ppcVar16[local_94]);
          option = strtok(pcVar10,"=");
          pcVar11 = strtok((char *)0x0,"=");
          sVar2 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
          if (sVar2 == 0) {
            bVar6 = true;
          }
          else {
            bVar6 = false;
            uVar19 = 0;
            do {
              if ((fctkern_ptr__->cl_parser).clo_list.used_itm_num <= uVar19) goto LAB_0010536e;
              clo = (fctcl_t *)(clp_00->clo_list).itm_list[uVar19];
              pcVar12 = option;
              iVar7 = fctcl__is_option(clo,option);
              if (iVar7 != 0) {
                bVar6 = true;
                if (clo->action == FCTCL_STORE_TRUE) {
                  s = "1";
                }
                else {
                  if (clo->action != FCTCL_STORE_VALUE) goto LAB_00104bba;
                  if ((pcVar11 == (char *)0x0) || (s = pcVar11, *pcVar11 == '\0')) {
                    local_94 = local_94 + 1;
                    if (iVar17 <= local_94) {
                      fct_snprintf(pcVar14,(size_t)pcVar12,"missing argument for %s",option);
                      (fctkern_ptr__->cl_parser).is_error = 1;
                      goto LAB_00104bba;
                    }
                    s = ppcVar16[local_94];
                  }
                }
                pcVar12 = fctstr_clone(s);
                clo->value = pcVar12;
              }
LAB_00104bba:
            } while ((sVar2 - 1 != uVar19) && (uVar19 = uVar19 + 1, iVar7 == 0));
            bVar6 = !bVar6;
          }
          if ((fctkern_ptr__->cl_parser).is_error != 0) break;
          if (bVar6) {
            fct_nlist__append(&(fctkern_ptr__->cl_parser).param_list,pcVar10);
            pcVar10 = (char *)0x0;
          }
          if (pcVar10 != (char *)0x0) {
            free(pcVar10);
          }
          local_94 = local_94 + 1;
        } while (local_94 < iVar17);
      }
      if ((fctkern_ptr__->cl_parser).is_error == 0) {
        sVar2 = (fctkern_ptr__->cl_parser).param_list.used_itm_num;
        if (sVar2 != 0) {
          uVar19 = 0;
          do {
            if ((fctkern_ptr__->cl_parser).param_list.used_itm_num <= uVar19) goto LAB_0010536e;
            pcVar14 = (char *)(fctkern_ptr__->cl_parser).param_list.itm_list[uVar19];
            if (pcVar14 == (char *)0x0) {
              __assert_fail("prefix_filter != __null && \"invalid arg\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
            }
            sVar13 = strlen(pcVar14);
            if (sVar13 == 0) {
              __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
            }
            pcVar10 = (char *)malloc(sVar13 + 1);
            fctstr_safe_cpy(pcVar10,pcVar14,sVar13 + 1);
            fct_nlist__append(&fctkern_ptr__->prefix_list,pcVar10);
            uVar19 = uVar19 + 1;
          } while (sVar2 != uVar19);
        }
        pcVar14 = fct_clp__optval2(clp_00,"--version",(char *)0x0);
        if (pcVar14 == (char *)0x0) {
          pcVar14 = fct_clp__optval2(clp_00,"--help",(char *)0x0);
          __stream = _stdout;
          if (pcVar14 == (char *)0x0) {
            pcVar14 = fct_clp__optval2(clp_00,"--logger","standard");
            if (pcVar14 == (char *)0x0) {
              __assert_fail("sel_logger != __null && \"should never be NULL\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
            }
            if (fctkern_ptr__->lt_usr == (fct_logger_types_t *)0x0) {
              itm = (fct_logger_i *)0x0;
            }
            else {
              itm = fckern_sel_log(fctkern_ptr__->lt_usr,pcVar14);
            }
            if (itm == (fct_logger_i *)0x0 && fctkern_ptr__->lt_sys != (fct_logger_types_t *)0x0) {
              itm = fckern_sel_log(fctkern_ptr__->lt_sys,pcVar14);
            }
            if (itm == (fct_logger_i *)0x0) {
              fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar14);
            }
            else {
              fct_nlist__append(&fctkern_ptr__->logger_list,itm);
            }
            local_80 = 0;
            if (itm == (fct_logger_i *)0x0) goto LAB_00104cfb;
            fctkern_ptr__->cl_is_parsed = 1;
            iVar17 = 1;
          }
          else {
            fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
            sVar2 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
            if (sVar2 != 0) {
              uVar19 = 0;
              do {
                if ((fctkern_ptr__->cl_parser).clo_list.used_itm_num <= uVar19) goto LAB_0010536e;
                puVar3 = (undefined8 *)(clp_00->clo_list).itm_list[uVar19];
                if (puVar3[1] == 0) {
                  fprintf(__stream,"%s\n",*puVar3);
                }
                else {
                  fprintf(__stream,"%s, %s\n");
                }
                iVar17 = fctstr_ieq((char *)*puVar3,"--logger");
                if (iVar17 == 0) {
                  fprintf(__stream,"  %s\n",puVar3[3]);
                }
                else {
                  local_48[0] = fctkern_ptr__->lt_sys;
                  local_48[1] = fctkern_ptr__->lt_usr;
                  fputs("  Sets the logger. The types of loggers currently available are,\n",
                        __stream);
                  lVar18 = 0;
                  do {
                    pfVar4 = local_48[lVar18];
                    if (pfVar4 != (fct_logger_types_t *)0x0) {
                      pcVar14 = pfVar4->name;
                      while (pcVar14 != (char *)0x0) {
                        fprintf(__stream,"   =%s : %s\n",pcVar14,pfVar4->desc);
                        pcVar14 = pfVar4[1].name;
                        pfVar4 = pfVar4 + 1;
                      }
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 2);
                  fprintf(__stream,"  default is \'%s\'.\n","standard");
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 != sVar2);
            }
            fputs("\n",__stream);
            iVar17 = -1;
            local_80 = 0;
          }
        }
        else {
          printf("Built using FCTX version %s.\n","1.6.1");
LAB_00104cfb:
          local_80 = 0;
          iVar17 = -1;
        }
      }
      else {
        iVar17 = 0;
        fprintf(_stderr,"error: %s",pcVar14);
      }
    }
  }
  sVar2 = (fctkern_ptr__->logger_list).used_itm_num;
  if (sVar2 != 0) {
    uVar19 = 0;
    do {
      if ((fctkern_ptr__->logger_list).used_itm_num <= uVar19) goto LAB_0010536e;
      pvVar5 = (fctkern_ptr__->logger_list).itm_list[uVar19];
      *(fctkern_t **)((long)pvVar5 + 0x58) = fctkern_ptr__;
      (**(code **)((long)pvVar5 + 0x28))(pvVar5,(long)pvVar5 + 0x58);
      uVar19 = uVar19 + 1;
    } while (sVar2 != uVar19);
  }
  if (iVar17 + 1U < 2) {
    fct_ts__del((fctkern_ptr__->ns).ts_curr);
    fctkern__final(fctkern_ptr__);
    exit(local_80);
  }
LAB_00104f81:
  pfVar8 = (fctkern_ptr__->ns).ts_curr;
  if (pfVar8 == (fct_ts_t *)0x0) {
    fctkern__log_warn(fctkern_ptr__,"out of memory");
    return;
  }
  if (fctkern_ptr__ == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x915
                  ,"void fctkern__log_suite_start(fctkern_t *, const fct_ts_t *)");
  }
  sVar2 = (fctkern_ptr__->logger_list).used_itm_num;
  if (sVar2 != 0) {
    uVar19 = 0;
    do {
      if ((fctkern_ptr__->logger_list).used_itm_num <= uVar19) goto LAB_0010536e;
      pvVar5 = (fctkern_ptr__->logger_list).itm_list[uVar19];
      *(fct_ts_t **)((long)pvVar5 + 0x70) = pfVar8;
      (**(code **)((long)pvVar5 + 0x18))(pvVar5,(long)pvVar5 + 0x58);
      uVar19 = uVar19 + 1;
    } while (sVar2 != uVar19);
  }
LAB_00104fed:
  do {
    (fctkern_ptr__->ns).test_num = -1;
    pfVar8 = (fctkern_ptr__->ns).ts_curr;
    tVar1 = pfVar8->mode;
    if (tVar1 == ts_mode_setup) {
      pfVar8->mode = ts_mode_test;
    }
    else if ((tVar1 == ts_mode_abort) || (tVar1 == ts_mode_ending)) {
      pfVar8->mode = ts_mode_end;
      if (pfVar8 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x8ad,"void fctkern__add_ts(fctkern_t *, fct_ts_t *)");
      }
      fct_nlist__append(&fctkern_ptr__->ts_list,pfVar8);
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x923,"void fctkern__log_suite_end(fctkern_t *, const fct_ts_t *)");
      }
      sVar2 = (fctkern_ptr__->logger_list).used_itm_num;
      if (sVar2 != 0) {
        uVar19 = 0;
        do {
          if ((fctkern_ptr__->logger_list).used_itm_num <= uVar19) {
LAB_0010536e:
            __assert_fail("idx < list->used_itm_num",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
          }
          pvVar5 = (fctkern_ptr__->logger_list).itm_list[uVar19];
          *(fct_ts_t **)((long)pvVar5 + 0x70) = pfVar8;
          (**(code **)((long)pvVar5 + 0x20))(pvVar5,(long)pvVar5 + 0x58);
          uVar19 = uVar19 + 1;
        } while (sVar2 != uVar19);
      }
      ((fctkern_ptr__->ns).ts_curr)->mode = ts_mode_end;
      (fctkern_ptr__->ns).ts_curr = (fct_ts_t *)0x0;
      return;
    }
    tVar1 = pfVar8->mode;
    if (tVar1 == ts_mode_teardown) {
      if (pfVar8 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x490,"int fct_ts__is_more_tests(const fct_ts_t *)");
      }
      pfVar8->mode = (uint)(pfVar8->total_test_num <= pfVar8->curr_test_num) * 3 + ts_mode_setup;
      goto LAB_00104fed;
    }
    (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
    (fctkern_ptr__->ns).test_num = 0;
    if (tVar1 == ts_mode_test) {
      iVar17 = fct_ts__is_test_cnt(pfVar8,0);
      if (iVar17 == 0) goto LAB_00105111;
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8->mode == ts_mode_end) goto LAB_001053ac;
      pfVar8->curr_test_num = pfVar8->curr_test_num + 1;
      iVar17 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
      if (iVar17 != 0) {
        pfVar15 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
        (fctkern_ptr__->ns).curr_test = pfVar15;
        if (pfVar15 == (fct_test_t *)0x0) {
LAB_001051dc:
          fctkern__log_warn(fctkern_ptr__,"out of memory");
        }
        else {
          if (((fctkern_ptr__->ns).ts_is_skip_suite != 0) || ((fctkern_ptr__->ns).test_is_skip != 0)
             ) goto LAB_00105185;
          fctkern__log_test_start(fctkern_ptr__,pfVar15);
          fct_test__start_timer((fctkern_ptr__->ns).curr_test);
          fct_xchk_test = (fctkern_ptr__->ns).curr_test;
          fct_xchk_lineno = 0x1b;
          pcVar14 = "1";
LAB_0010529e:
          fct_xchk_file =
               "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O1/tests/test_multi_suite1.cpp"
          ;
          fct_xchk_kern = fctkern_ptr__;
          fct_xchk_fn(1,pcVar14);
          fct_test__stop_timer((fctkern_ptr__->ns).curr_test);
        }
        fct_ts__add_test((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).curr_test);
        fctkern__log_test_end(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
      }
LAB_001051ff:
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x4ae,"void fct_ts__test_end(fct_ts_t *)");
      }
      pfVar8->mode = ts_mode_teardown;
    }
    else {
      if (tVar1 == ts_mode_cnt) {
        fct_ts__inc_total_test_num(pfVar8);
      }
LAB_00105111:
      (fctkern_ptr__->ns).curr_test_name = "simple__check_streq";
      iVar17 = (fctkern_ptr__->ns).test_num + 1;
      (fctkern_ptr__->ns).test_num = iVar17;
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8->mode == ts_mode_test) {
        iVar17 = fct_ts__is_test_cnt(pfVar8,iVar17);
        if (iVar17 != 0) {
          pfVar8 = (fctkern_ptr__->ns).ts_curr;
          if (pfVar8->mode == ts_mode_end) goto LAB_001053ac;
          pfVar8->curr_test_num = pfVar8->curr_test_num + 1;
          iVar17 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
          if (iVar17 != 0) {
            pfVar15 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
            (fctkern_ptr__->ns).curr_test = pfVar15;
            if (pfVar15 == (fct_test_t *)0x0) goto LAB_001051dc;
            if (((fctkern_ptr__->ns).ts_is_skip_suite == 0) &&
               ((fctkern_ptr__->ns).test_is_skip == 0)) {
              fctkern__log_test_start(fctkern_ptr__,pfVar15);
              fct_test__start_timer((fctkern_ptr__->ns).curr_test);
              fct_xchk_test = (fctkern_ptr__->ns).curr_test;
              fct_xchk_lineno = 0x20;
              fct_xchk_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O1/tests/test_multi_suite1.cpp"
              ;
              fct_xchk_kern = fctkern_ptr__;
              fct_xchk_fn(1,"streq(\"one\", \"one\")");
              fct_xchk_test = (fctkern_ptr__->ns).curr_test;
              fct_xchk_lineno = 0x21;
              pcVar14 = "!streq(\"one\", \"two\")";
              goto LAB_0010529e;
            }
LAB_00105185:
            pfVar8 = (fctkern_ptr__->ns).ts_curr;
            if (pfVar8->mode == ts_mode_end) {
LAB_001053ac:
              __assert_fail("!((ts)->mode == ts_mode_end)",
                            "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                            ,0x49a,"void fct_ts__test_begin(fct_ts_t *)");
            }
            pfVar8->curr_test_num = pfVar8->curr_test_num + 1;
            ppcVar16 = &(fctkern_ptr__->ns).test_skip_cndtn;
            if ((fctkern_ptr__->ns).test_is_skip == 0) {
              ppcVar16 = &(fctkern_ptr__->ns).ts_skip_cndtn;
            }
            fctkern__log_test_skip(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name,*ppcVar16);
          }
          goto LAB_001051ff;
        }
      }
      else if (pfVar8->mode == ts_mode_cnt) {
        fct_ts__inc_total_test_num(pfVar8);
      }
      pfVar8 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar8->mode == ts_mode_cnt) {
        if (pfVar8 == (fct_ts_t *)0x0) {
          __assert_fail("ts != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                        ,0x4fa,"void fct_ts__cnt_end(fct_ts_t *)");
        }
        pfVar8->mode = (uint)(pfVar8->total_test_num == 0) * 3 + ts_mode_setup;
      }
    }
  } while( true );
}

Assistant:

FCTMF_SUITE_BGN(test_suite1)
{
    FCT_TEST_BGN(simple__one_is_one)
    {
        fct_chk(1);
    }
    FCT_TEST_END();
    FCT_TEST_BGN(simple__check_streq)
    {
        fct_chk(streq("one", "one"));
        fct_chk(!streq("one", "two"));
    }
    FCT_TEST_END();
}